

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Node * __thiscall wasm::DataFlow::Graph::doVisitLocalSet(Graph *this,LocalSet *curr)

{
  pointer *pppLVar1;
  iterator __position;
  mapped_type pEVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  Node *pNVar5;
  Type TVar6;
  mapped_type *ppEVar7;
  Node *pNVar8;
  mapped_type *ppNVar9;
  mapped_type *ppEVar10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  Node *local_40;
  Node *node;
  LocalSet *curr_local;
  
  node = (Node *)curr;
  TVar6 = Function::getLocalType(this->func,curr->index);
  if (((TVar6.id & 0xfffffffffffffffe) == 2) &&
     ((this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if ((node->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start[1] < (Node *)0x2) {
      __assert_fail("curr->value->type.isConcrete()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                    ,0x195,"Node *wasm::DataFlow::Graph::doVisitLocalSet(LocalSet *)");
    }
    __position._M_current =
         (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::
      _M_realloc_insert<wasm::LocalSet*const&>
                ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)&this->sets,__position,
                 (LocalSet **)&node);
    }
    else {
      *__position._M_current = (LocalSet *)node;
      pppLVar1 = &(this->sets).
                  super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppLVar1 = *pppLVar1 + 1;
    }
    pEVar2 = this->parent;
    local_40 = node;
    ppEVar7 = std::__detail::
              _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->expressionParentMap,(key_type *)&local_40);
    pNVar5 = node;
    *ppEVar7 = pEVar2;
    ppEVar7 = std::__detail::
              _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->expressionParentMap,(key_type *)&node->values);
    *ppEVar7 = (mapped_type)pNVar5;
    pNVar8 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                        (Expression *)
                        (node->values).
                        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_40 = pNVar8;
    ppNVar9 = std::__detail::
              _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->setNodeMap,(key_type *)&node);
    pNVar5 = node;
    *ppNVar9 = pNVar8;
    (this->locals).
    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
    super__Vector_impl_data._M_start[*(uint *)&node->origin] = pNVar8;
    uVar3 = (this->nodeParentMap)._M_h._M_bucket_count;
    uVar11 = (ulong)local_40 % uVar3;
    p_Var12 = (this->nodeParentMap)._M_h._M_buckets[uVar11];
    p_Var13 = (__node_base_ptr)0x0;
    if ((p_Var12 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var12->_M_nxt, p_Var13 = p_Var12, local_40 != (Node *)p_Var12->_M_nxt[1]._M_nxt))
    {
      while (p_Var12 = p_Var4, p_Var4 = p_Var12->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var13 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar3 != uVar11) ||
           (p_Var13 = p_Var12, local_40 == (Node *)p_Var4[1]._M_nxt)) goto LAB_006c112b;
      }
      p_Var13 = (__node_base_ptr)0x0;
    }
LAB_006c112b:
    if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0)) {
      ppEVar10 = std::__detail::
                 _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->nodeParentMap,&local_40);
      *ppEVar10 = (mapped_type)pNVar5;
    }
  }
  return &this->bad;
}

Assistant:

Node* doVisitLocalSet(LocalSet* curr) {
    if (!isRelevantLocal(curr->index) || isInUnreachable()) {
      return &bad;
    }
    assert(curr->value->type.isConcrete());
    sets.push_back(curr);
    expressionParentMap[curr] = parent;
    expressionParentMap[curr->value] = curr;
    // Set the current node in the local state.
    auto* node = visit(curr->value);
    locals[curr->index] = setNodeMap[curr] = node;
    // If we created a new node (and not just did a get of a set, which
    // passes around an existing node), mark its parent.
    if (nodeParentMap.find(node) == nodeParentMap.end()) {
      nodeParentMap[node] = curr;
    }
    return &bad;
  }